

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O0

StringPiece * __thiscall re2::StringPiece::as_string_abi_cxx11_(StringPiece *this)

{
  int iVar1;
  char *pcVar2;
  StringPiece *in_RSI;
  allocator local_19 [9];
  StringPiece *this_local;
  
  this_local = this;
  pcVar2 = data(in_RSI);
  iVar1 = size(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar2,(long)iVar1,local_19);
  std::allocator<char>::~allocator((allocator<char> *)local_19);
  return this;
}

Assistant:

std::string as_string() const {
    return std::string(data(), size());
  }